

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O0

void __thiscall Corrade::Utility::Arguments::Arguments(Arguments *this,string *prefix,Flags flags)

{
  InternalFlag value;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  string *local_20;
  string *prefix_local;
  Arguments *this_local;
  Flags flags_local;
  
  local_20 = prefix;
  prefix_local = (string *)this;
  this_local._7_1_ = flags._value;
  value = Containers::EnumSet::operator_cast_to_unsigned_char((EnumSet *)((long)&this_local + 7));
  Containers::EnumSet<Corrade::Utility::Arguments::InternalFlag,_(unsigned_char)'\xff'>::EnumSet
            (&this->_flags,value);
  this->_finalOptionalArgument = 0;
  this->_arrayArgument = 0;
  std::operator+(&this->_prefix,local_20,'-');
  std::__cxx11::string::string((string *)&this->_command);
  std::__cxx11::string::string((string *)&this->_help);
  Containers::
  Array<Corrade::Utility::Arguments::Entry,_void_(*)(Corrade::Utility::Arguments::Entry_*,_unsigned_long)>
  ::Array(&this->_entries);
  Containers::
  Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>
  ::Array(&this->_values);
  Containers::
  Array<Corrade::Containers::Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>,_void_(*)(Corrade::Containers::Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>_*,_unsigned_long)>
  ::Array(&this->_arrayValues);
  Containers::
  Array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_(*)(std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_unsigned_long)>
  ::Array(&this->_skippedPrefixes);
  Containers::Array<bool,_void_(*)(bool_*,_unsigned_long)>::Array(&this->_booleans);
  this->_parseErrorCallback = anon_unknown_3::defaultParseErrorCallback;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"help",&local_41);
  addBooleanOption(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"help",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"display this help message and exit",&local_a1);
  std::__cxx11::string::string((string *)&local_c8);
  setHelp(this,&local_78,&local_a0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return;
}

Assistant:

Arguments::Arguments(const std::string& prefix, Flags flags): _flags{InternalFlag(std::uint8_t(flags))}, _prefix{prefix + '-'}, _parseErrorCallback{defaultParseErrorCallback} {
    /* Add help option */
    addBooleanOption("help");
    setHelp("help", "display this help message and exit");
}